

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_tests.cpp
# Opt level: O1

void __thiscall
compress_tests::compress_script_to_cscript_id::test_method(compress_script_to_cscript_id *this)

{
  uint uVar1;
  uint uVar2;
  size_type sVar3;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_00;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar4;
  undefined8 uVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  undefined8 uVar8;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  size_type local_1ac;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  assertion_result local_188;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  bool done;
  undefined1 local_144 [20];
  char *local_130;
  char *local_128;
  size_type *local_120;
  lazy_ostream local_118;
  undefined1 *local_108;
  size_type **local_100;
  CompressedScript *local_f8;
  size_type **local_f0;
  char *local_e8;
  assertion_result local_e0;
  CompressedScript out;
  CScript redeemScript;
  CScript script;
  undefined1 local_58 [20];
  uchar auStack_44 [4];
  CompressedScript **local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  script.super_CScriptBase._union._16_8_ = 0;
  script.super_CScriptBase._24_8_ = 0;
  script.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  script.super_CScriptBase._union._8_8_ = 0;
  redeemScript.super_CScriptBase._union._16_8_ = 0;
  redeemScript.super_CScriptBase._24_8_ = 0;
  redeemScript.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  redeemScript.super_CScriptBase._union._8_8_ = 0;
  out._union.direct[0] = 0xa9;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&script.super_CScriptBase,(iterator)&script.super_CScriptBase,(uchar *)&out);
  CScriptID::CScriptID((CScriptID *)local_58,&redeemScript);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&out,local_58,auStack_44,
             (allocator_type *)&local_118);
  this_00 = &CScript::operator<<(&script,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &out)->super_CScriptBase;
  uVar1 = this_00->_size;
  uVar2 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar2 = uVar1;
  }
  ppVar4 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (this_00->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar4 = this_00;
  }
  local_118._vptr_lazy_ostream = (_func_int **)CONCAT71(local_118._vptr_lazy_ostream._1_7_,0x87);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (this_00,(uchar *)((long)&ppVar4->_union + (long)(int)uVar2),(uchar *)&local_118);
  if (out._union.indirect_contents.indirect != (char *)0x0) {
    operator_delete(out._union.indirect_contents.indirect,out._union._16_8_ - out._union._0_8_);
  }
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_128 = "";
  local_144._4_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_144._12_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x5a;
  file.m_begin = (iterator)&local_130;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)(local_144 + 4),msg
            );
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  sVar3 = script.super_CScriptBase._size - 0x1d;
  if (script.super_CScriptBase._size < 0x1d) {
    sVar3 = script.super_CScriptBase._size;
  }
  local_100 = (size_type **)0xf98c4c;
  local_f0 = &local_120;
  local_120 = (size_type *)CONCAT44(local_120._4_4_,sVar3);
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(sVar3 == 0x17);
  local_f8 = (CompressedScript *)local_144;
  local_144._0_4_ = 0x17;
  local_188.m_message.px = (element_type *)0x0;
  local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_e0.m_message.px = (element_type *)0xe9a972;
  out._union._24_8_ = &local_f0;
  out._union._8_8_ = out._union._8_8_ & 0xffffffffffffff00;
  out._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013d3d30;
  out._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40 = &local_f8;
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_013d3d30;
  stack0xffffffffffffffb8 = boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_188,&local_118,1,2,REQUIRE,0xe9aa89,(size_t)&local_e0,0x5a,&out,"23U",local_58);
  boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
  out._union._16_8_ = 0;
  out._union._24_8_ = 0;
  out._union.indirect_contents.indirect = (char *)0x0;
  out._union._8_8_ = 0;
  out._union.direct[0x20] = '\0';
  out._size = 0;
  done = CompressScript(&script,&out);
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x5e;
  file_00.m_begin = (iterator)&local_158;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_168,
             msg_00);
  local_188.m_message.px = (element_type *)((ulong)local_188.m_message.px & 0xffffffffffffff00);
  local_188._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_188.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_170 = "";
  local_144[0] = 1;
  local_f8 = (CompressedScript *)&done;
  local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)done;
  local_e0.m_message.px = (element_type *)0x0;
  local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0 = (size_type **)0xe9a912;
  local_e8 = "";
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_013d4010;
  stack0xffffffffffffffb8 = boost::unit_test::lazy_ostream::inst;
  local_40 = &local_f8;
  local_120 = (size_type *)local_144;
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d4010;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,(lazy_ostream *)&local_188,1,2,REQUIRE,0xfeb143,(size_t)&local_f0,0x5e,
             local_58,"true",&local_118);
  boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x61;
  file_01.m_begin = (iterator)&local_198;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1a8,
             msg_01);
  local_188.m_message.px = (element_type *)((ulong)local_188.m_message.px & 0xffffffffffffff00);
  local_188._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_188.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_144._0_4_ = out._size - 0x22;
  if (out._size < 0x22) {
    local_144._0_4_ = out._size;
  }
  local_170 = "";
  local_120 = &local_1ac;
  local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_144._0_4_ == 0x15);
  local_1ac = 0x15;
  local_e0.m_message.px = (element_type *)0x0;
  local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0 = (size_type **)0xe9a912;
  local_e8 = "";
  local_f8 = (CompressedScript *)local_144;
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_013d3d30;
  stack0xffffffffffffffb8 = boost::unit_test::lazy_ostream::inst;
  local_40 = &local_f8;
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3d30;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,(lazy_ostream *)&local_188,1,2,REQUIRE,0xfadf88,(size_t)&local_f0,0x61,
             local_58,"21U",&local_118);
  boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x62;
  file_02.m_begin = (iterator)&local_1c0;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1d0,
             msg_02);
  local_188.m_message.px = (element_type *)((ulong)local_188.m_message.px & 0xffffffffffffff00);
  local_188._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_188.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_170 = "";
  local_f8 = &out;
  if (0x21 < out._size) {
    local_f8 = (CompressedScript *)out._union.indirect_contents.indirect;
  }
  local_144._0_4_ = 1;
  local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_f8->_union).direct[0] == '\x01');
  local_e0.m_message.px = (element_type *)0x0;
  local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0 = (size_type **)0xe9a912;
  local_e8 = "";
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_013d4aa0;
  stack0xffffffffffffffb8 = boost::unit_test::lazy_ostream::inst;
  local_40 = &local_f8;
  local_120 = (size_type *)local_144;
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3e70;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,(lazy_ostream *)&local_188,1,2,REQUIRE,0xf6e480,(size_t)&local_f0,0x62,
             local_58,"0x01",&local_118);
  boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x63;
  file_03.m_begin = (iterator)&local_1e0;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1f0,
             msg_03);
  local_188.m_message.px = (element_type *)((ulong)local_188.m_message.px & 0xffffffffffffff00);
  local_188._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_188.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_170 = "";
  uVar5 = out._union.indirect_contents.indirect;
  if (out._size < 0x22) {
    uVar5 = &out;
  }
  uVar8 = &script;
  if (0x1c < script.super_CScriptBase._size) {
    uVar8 = script.super_CScriptBase._union.indirect_contents.indirect;
  }
  local_144._0_4_ =
       memcmp((void *)((long)&((CompressedScript *)uVar5)->_union + 1),
              (void *)((long)&(((CScript *)uVar8)->super_CScriptBase)._union + 2),0x14);
  local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_144._0_4_ == 0);
  local_1ac = 0;
  local_e0.m_message.px = (element_type *)0x0;
  local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0 = (size_type **)0xe9a912;
  local_e8 = "";
  local_f8 = (CompressedScript *)local_144;
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_013d3e70;
  stack0xffffffffffffffb8 = boost::unit_test::lazy_ostream::inst;
  local_40 = &local_f8;
  local_120 = &local_1ac;
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3e70;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,(lazy_ostream *)&local_188,1,2,REQUIRE,0xe9aaf0,(size_t)&local_f0,99,local_58
             ,"0",&local_118);
  boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
  if (0x21 < out._size) {
    free(out._union.indirect_contents.indirect);
    out._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x1c < redeemScript.super_CScriptBase._size) {
    free(redeemScript.super_CScriptBase._union.indirect_contents.indirect);
    redeemScript.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x1c < script.super_CScriptBase._size) {
    free(script.super_CScriptBase._union.indirect_contents.indirect);
    script.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(compress_script_to_cscript_id)
{
    // case CScriptID
    CScript script, redeemScript;
    script << OP_HASH160 << ToByteVector(CScriptID(redeemScript)) << OP_EQUAL;
    BOOST_CHECK_EQUAL(script.size(), 23U);

    CompressedScript out;
    bool done = CompressScript(script, out);
    BOOST_CHECK_EQUAL(done, true);

    // Check compressed script
    BOOST_CHECK_EQUAL(out.size(), 21U);
    BOOST_CHECK_EQUAL(out[0], 0x01);
    BOOST_CHECK_EQUAL(memcmp(out.data() + 1, script.data() + 2, 20), 0); // compare the 20 relevant chars of the CScriptId in the script
}